

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O1

size_t rtosc_scan_message(char *src,char *address,size_t adrsize,rtosc_arg_val_t *args,size_t n,
                         char *buffer_for_strings,size_t bufsize)

{
  char *pcVar1;
  ushort **ppuVar2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  char cVar6;
  ulong uVar7;
  int local_54;
  size_t local_50;
  rtosc_arg_val_t *local_48;
  size_t local_40;
  char *local_38;
  
  cVar6 = *src;
  local_50 = adrsize;
  local_48 = args;
  local_40 = n;
  local_38 = buffer_for_strings;
  if (cVar6 == '\0') {
    uVar7 = 0;
  }
  else {
    ppuVar2 = __ctype_b_loc();
    uVar7 = 0;
    do {
      if ((*(byte *)((long)*ppuVar2 + (long)cVar6 * 2 + 1) & 0x20) == 0) break;
      cVar6 = src[uVar7 + 1];
      uVar7 = uVar7 + 1;
    } while (cVar6 != '\0');
    src = src + uVar7;
  }
  if (*src == '%') {
    pcVar5 = src;
    do {
      local_54 = 0;
      __isoc99_sscanf(pcVar5,"%*[^\n] %n",&local_54);
      lVar3 = (long)local_54;
      src = pcVar5 + lVar3;
      uVar7 = uVar7 + lVar3;
      pcVar1 = pcVar5 + lVar3;
      pcVar5 = src;
    } while (*pcVar1 == '%');
  }
  cVar6 = *src;
  if (cVar6 != '\0') {
    ppuVar2 = __ctype_b_loc();
    do {
      if (((*(byte *)((long)*ppuVar2 + (long)cVar6 * 2 + 1) & 0x20) != 0) || (local_50 <= uVar7))
      break;
      *address = cVar6;
      address = address + 1;
      uVar7 = uVar7 + 1;
      cVar6 = src[1];
      src = src + 1;
    } while (cVar6 != '\0');
  }
  *address = '\0';
  cVar6 = *src;
  if (cVar6 != '\0') {
    ppuVar2 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar2 + (long)cVar6 * 2 + 1) & 0x20) == 0) break;
      uVar7 = uVar7 + 1;
      cVar6 = src[1];
      src = src + 1;
    } while (cVar6 != '\0');
  }
  sVar4 = rtosc_scan_arg_vals(src,local_48,local_40,local_38,bufsize);
  return sVar4 + uVar7;
}

Assistant:

size_t rtosc_scan_message(const char* src,
                          char* address, size_t adrsize,
                          rtosc_arg_val_t *args, size_t n,
                          char* buffer_for_strings, size_t bufsize)
{
    size_t rd = 0;
    for(;*src && isspace(*src); ++src) ++rd;
    while (*src == '%')
        rd += skip_fmt(&src, "%*[^\n] %n");

    assert(*src == '/');
    for(; *src && !isspace(*src) && rd < adrsize; ++rd)
        *address++ = *src++;
    assert(rd < adrsize); // otherwise, the address was too long
    *address = 0;

    for(;*src && isspace(*src); ++src) ++rd;

    rd += rtosc_scan_arg_vals(src, args, n, buffer_for_strings, bufsize);

    return rd;
}